

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::DescriptiveFramework::DescriptiveFramework(DescriptiveFramework *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UUID *pUVar3;
  MDDEntry *pMVar4;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__DescriptiveFramework_00225ee8;
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &(this->LinkedDescriptiveFrameworkPlugInId).m_property;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->LinkedDescriptiveFrameworkPlugInId).m_property.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_00223d80;
  (this->LinkedDescriptiveFrameworkPlugInId).m_has_value = false;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_DescriptiveFramework);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xbd1,"ASDCP::MXF::DescriptiveFramework::DescriptiveFramework(const Dictionary *)")
  ;
}

Assistant:

DescriptiveFramework::DescriptiveFramework(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_DescriptiveFramework);
}